

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdSignPsbt(void *handle,void *psbt_handle,char *privkey,bool has_grind_r)

{
  bool bVar1;
  CfdException *pCVar2;
  string privkey_str;
  Privkey privkey_obj;
  Privkey local_48;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&privkey_str,"PsbtHandle",(allocator *)&privkey_obj);
  cfd::capi::CheckBuffer(psbt_handle,&privkey_str);
  std::__cxx11::string::~string((string *)&privkey_str);
  bVar1 = cfd::capi::IsEmptyString(privkey);
  if (bVar1) {
    privkey_str._M_dataplus._M_p = "cfdcapi_psbt.cpp";
    privkey_str._M_string_length._0_4_ = 0x1c5;
    privkey_str.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_7cb5b7;
    cfd::core::logger::warn<>((CfdSourceLocation *)&privkey_str,"privkey is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&privkey_str,"Failed to parameter. privkey is null or empty.",
               (allocator *)&privkey_obj);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,&privkey_str);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)psbt_handle + 0x18) != 0) {
    std::__cxx11::string::string((string *)&privkey_str,privkey,(allocator *)&privkey_obj);
    cfd::core::Privkey::Privkey(&privkey_obj);
    bVar1 = cfd::core::Privkey::HasWif(&privkey_str,(NetType *)0x0,(bool *)0x0);
    if (bVar1) {
      cfd::core::Privkey::FromWif(&local_48,&privkey_str,kCustomChain,true);
    }
    else {
      cfd::core::Privkey::Privkey(&local_48,&privkey_str,kMainnet,true);
    }
    cfd::core::Privkey::operator=(&privkey_obj,&local_48);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48);
    cfd::core::Psbt::Sign(*(Psbt **)((long)psbt_handle + 0x18),&privkey_obj,has_grind_r);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&privkey_obj);
    std::__cxx11::string::~string((string *)&privkey_str);
    return 0;
  }
  privkey_str._M_dataplus._M_p = "cfdcapi_psbt.cpp";
  privkey_str._M_string_length._0_4_ = 0x1cb;
  privkey_str.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_7cb5b7;
  cfd::core::logger::warn<>((CfdSourceLocation *)&privkey_str,"psbt is null.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&privkey_str,"Failed to handle statement. psbt is null.",
             (allocator *)&privkey_obj);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,&privkey_str);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSignPsbt(
    void* handle, void* psbt_handle, const char* privkey, bool has_grind_r) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(privkey)) {
      warn(CFD_LOG_SOURCE, "privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    std::string privkey_str(privkey);
    Privkey privkey_obj;
    if (Privkey::HasWif(privkey_str)) {
      privkey_obj = Privkey::FromWif(privkey_str);
    } else {
      privkey_obj = Privkey(privkey_str);
    }
    psbt_obj->psbt->Sign(privkey_obj, has_grind_r);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}